

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topten.c
# Opt level: O3

void read_log_toptenentry(int fd,nh_topten_entry *entry)

{
  char *line;
  int size;
  toptenentry tt;
  int local_dc;
  toptenentry local_d8;
  
  line = loadfile(fd,&local_dc);
  if (line != (char *)0x0) {
    readentry(line,&local_d8);
    fill_nh_score_entry(&local_d8,entry,-1,'\0');
    free(line);
  }
  return;
}

Assistant:

void read_log_toptenentry(int fd, struct nh_topten_entry *entry)
{
    struct toptenentry tt;
    int size;
    char *line = loadfile(fd, &size);
    if (!line)
	return;
    
    readentry(line, &tt);
    fill_nh_score_entry(&tt, entry, -1, FALSE);
    free(line);
}